

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodFactory.hpp
# Opt level: O0

void __thiscall OpenMD::RNEMD::MethodFactory::MethodFactory(MethodFactory *this,string *methodStr)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000018;
  
  Utils::traits_cast<OpenMD::Utils::ci_char_traits,std::char_traits<char>>(in_stack_00000018);
  return;
}

Assistant:

explicit MethodFactory(const std::string& methodStr) :
        methodStr_ {Utils::traits_cast<Utils::ci_char_traits>(methodStr)} {}